

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O0

void dsa_sign(ssh_key *key,ptrlen data,uint flags,BinarySink *bs)

{
  BinarySink *pBVar1;
  uint8_t uVar2;
  mp_int *x;
  mp_int *x_00;
  mp_int *pmVar3;
  mp_int *y;
  mp_int *x_01;
  mp_int *y_00;
  mp_int *x_02;
  ptrlen bytes;
  mp_int *s;
  mp_int *hxr;
  mp_int *xr;
  mp_int *hash;
  mp_int *r;
  mp_int *gkp;
  mp_int *kinv;
  mp_int *k;
  uchar local_58 [4];
  int i;
  uchar digest [20];
  dsa_key *dsa;
  BinarySink *bs_local;
  uint flags_local;
  ssh_key *key_local;
  ptrlen data_local;
  
  hash_simple(&ssh_sha1,data,local_58);
  x = dsa_gen_k("DSA deterministic k generator",(mp_int *)key[-4].vt,(mp_int *)key[-1].vt,local_58,
                0x14);
  x_00 = mp_invert(x,(mp_int *)key[-4].vt);
  pmVar3 = mp_modpow((mp_int *)key[-3].vt,x,(mp_int *)key[-5].vt);
  y = mp_mod(pmVar3,(mp_int *)key[-4].vt);
  mp_free(pmVar3);
  bytes = make_ptrlen(local_58,0x14);
  pmVar3 = mp_from_bytes_be(bytes);
  x_01 = mp_mul((mp_int *)key[-1].vt,y);
  y_00 = mp_add(x_01,pmVar3);
  x_02 = mp_modmul(x_00,y_00,(mp_int *)key[-4].vt);
  mp_free(y_00);
  mp_free(x_01);
  mp_free(x_00);
  mp_free(x);
  mp_free(pmVar3);
  BinarySink_put_stringz(bs->binarysink_,"ssh-dss");
  BinarySink_put_uint32(bs->binarysink_,0x28);
  for (k._4_4_ = 0; k._4_4_ < 0x14; k._4_4_ = k._4_4_ + 1) {
    pBVar1 = bs->binarysink_;
    uVar2 = mp_get_byte(y,(long)(0x13 - k._4_4_));
    BinarySink_put_byte(pBVar1,uVar2);
  }
  for (k._4_4_ = 0; k._4_4_ < 0x14; k._4_4_ = k._4_4_ + 1) {
    pBVar1 = bs->binarysink_;
    uVar2 = mp_get_byte(x_02,(long)(0x13 - k._4_4_));
    BinarySink_put_byte(pBVar1,uVar2);
  }
  mp_free(y);
  mp_free(x_02);
  return;
}

Assistant:

static void dsa_sign(ssh_key *key, ptrlen data, unsigned flags, BinarySink *bs)
{
    struct dsa_key *dsa = container_of(key, struct dsa_key, sshk);
    unsigned char digest[20];
    int i;

    hash_simple(&ssh_sha1, data, digest);

    mp_int *k = dsa_gen_k("DSA deterministic k generator", dsa->q, dsa->x,
                          digest, sizeof(digest));
    mp_int *kinv = mp_invert(k, dsa->q);       /* k^-1 mod q */

    /*
     * Now we have k, so just go ahead and compute the signature.
     */
    mp_int *gkp = mp_modpow(dsa->g, k, dsa->p); /* g^k mod p */
    mp_int *r = mp_mod(gkp, dsa->q);        /* r = (g^k mod p) mod q */
    mp_free(gkp);

    mp_int *hash = mp_from_bytes_be(make_ptrlen(digest, 20));
    mp_int *xr = mp_mul(dsa->x, r);
    mp_int *hxr = mp_add(xr, hash);         /* hash + x*r */
    mp_int *s = mp_modmul(kinv, hxr, dsa->q); /* s = k^-1 * (hash+x*r) mod q */
    mp_free(hxr);
    mp_free(xr);
    mp_free(kinv);
    mp_free(k);
    mp_free(hash);

    put_stringz(bs, "ssh-dss");
    put_uint32(bs, 40);
    for (i = 0; i < 20; i++)
        put_byte(bs, mp_get_byte(r, 19 - i));
    for (i = 0; i < 20; i++)
        put_byte(bs, mp_get_byte(s, 19 - i));
    mp_free(r);
    mp_free(s);
}